

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

void bhf::ads::ParseHexData(RegistryEntry *value,char **it,istream *input,size_t *lineNumber)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  unsigned_long uVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  istream *piVar7;
  char *pcVar8;
  string local_a70 [32];
  stringstream local_a50 [8];
  stringstream ss_5;
  ostream local_a40 [382];
  byte local_8c2;
  undefined1 local_8c1;
  string local_8c0 [6];
  uint8_t byte;
  stringstream local_8a0 [8];
  stringstream ss_4;
  ostream local_890 [376];
  int local_718;
  undefined1 local_711;
  int i;
  stringstream local_6f0 [8];
  stringstream ss_3;
  ostream local_6e0 [383];
  undefined1 local_561;
  string local_560 [32];
  stringstream local_540 [8];
  stringstream ss_2;
  ostream local_530 [383];
  undefined1 local_3b1;
  string local_3b0 [32];
  stringstream local_390 [8];
  stringstream ss_1;
  ostream local_380 [383];
  undefined1 local_201;
  string local_200 [48];
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  string local_48 [8];
  string line;
  size_t *lineNumber_local;
  istream *input_local;
  char **it_local;
  RegistryEntry *value_local;
  
  std::__cxx11::string::string(local_48);
  do {
    while( true ) {
      if (**it == '\0') {
        VerifyDataLen(value->type,value->dataLen,*lineNumber);
        std::__cxx11::string::~string(local_48);
        return;
      }
      if (**it != ',') break;
      *it = *it + 1;
      if (**it == ',') {
        std::__cxx11::stringstream::stringstream(local_1d0);
        uVar4 = std::numeric_limits<unsigned_long>::max();
        if (uVar4 == *lineNumber) {
          poVar5 = std::operator<<(local_1c0,"Invalid network data: ");
          poVar5 = std::operator<<(poVar5,"two subsequent commas");
          std::operator<<(poVar5,'\n');
        }
        else {
          poVar5 = std::operator<<(local_1c0,"Invalid file format: ");
          poVar5 = std::operator<<(poVar5,"two subsequent commas");
          poVar5 = std::operator<<(poVar5," in line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*lineNumber);
          std::operator<<(poVar5,'\n');
        }
        local_201 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_200);
        local_201 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (**it == '\\') {
      *it = *it + 1;
      if (**it != '\0') {
        std::__cxx11::stringstream::stringstream(local_390);
        uVar4 = std::numeric_limits<unsigned_long>::max();
        if (uVar4 == *lineNumber) {
          poVar5 = std::operator<<(local_380,"Invalid network data: ");
          poVar5 = std::operator<<(poVar5,
                                   "data continuation line should be the las character in line");
          std::operator<<(poVar5,'\n');
        }
        else {
          poVar5 = std::operator<<(local_380,"Invalid file format: ");
          poVar5 = std::operator<<(poVar5,
                                   "data continuation line should be the las character in line");
          poVar5 = std::operator<<(poVar5," in line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*lineNumber);
          std::operator<<(poVar5,'\n');
        }
        local_3b1 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_3b0);
        local_3b1 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(input,local_48);
      bVar1 = std::ios::operator!((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if ((bVar1 & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_540);
        uVar4 = std::numeric_limits<unsigned_long>::max();
        if (uVar4 == *lineNumber) {
          poVar5 = std::operator<<(local_530,"Invalid network data: ");
          poVar5 = std::operator<<(poVar5,"data continuation line next line is missing");
          std::operator<<(poVar5,'\n');
        }
        else {
          poVar5 = std::operator<<(local_530,"Invalid file format: ");
          poVar5 = std::operator<<(poVar5,"data continuation line next line is missing");
          poVar5 = std::operator<<(poVar5," in line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*lineNumber);
          std::operator<<(poVar5,'\n');
        }
        local_561 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_560);
        local_561 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar8 = (char *)std::__cxx11::string::c_str();
      *it = pcVar8;
      iVar3 = strncmp("  ",*it,2);
      if (iVar3 != 0) {
        std::__cxx11::stringstream::stringstream(local_6f0);
        uVar4 = std::numeric_limits<unsigned_long>::max();
        if (uVar4 == *lineNumber) {
          poVar5 = std::operator<<(local_6e0,"Invalid network data: ");
          poVar5 = std::operator<<(poVar5,"data continuation line should start with two spaces");
          std::operator<<(poVar5,'\n');
        }
        else {
          poVar5 = std::operator<<(local_6e0,"Invalid file format: ");
          poVar5 = std::operator<<(poVar5,"data continuation line should start with two spaces");
          poVar5 = std::operator<<(poVar5," in line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*lineNumber);
          std::operator<<(poVar5,'\n');
        }
        local_711 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,(string *)&i);
        local_711 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *it = *it + 2;
    }
    for (local_718 = 0; local_718 < 2; local_718 = local_718 + 1) {
      iVar3 = isxdigit((int)(*it)[local_718]);
      if (iVar3 == 0) {
        std::__cxx11::stringstream::stringstream(local_8a0);
        uVar4 = std::numeric_limits<unsigned_long>::max();
        if (uVar4 == *lineNumber) {
          poVar5 = std::operator<<(local_890,"Invalid network data: ");
          poVar5 = std::operator<<(poVar5,"invalid hex character \'");
          poVar5 = std::operator<<(poVar5,(*it)[local_718]);
          poVar5 = std::operator<<(poVar5,"\'");
          std::operator<<(poVar5,'\n');
        }
        else {
          poVar5 = std::operator<<(local_890,"Invalid file format: ");
          poVar5 = std::operator<<(poVar5,"invalid hex character \'");
          poVar5 = std::operator<<(poVar5,(*it)[local_718]);
          poVar5 = std::operator<<(poVar5,"\'");
          poVar5 = std::operator<<(poVar5," in line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*lineNumber);
          std::operator<<(poVar5,'\n');
        }
        local_8c1 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar6,local_8c0);
        local_8c1 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    uVar2 = hex2val(**it);
    bVar1 = hex2val((*it)[1]);
    local_8c2 = uVar2 << 4 | bVar1 & 0xf;
    RegistryEntry::PushData<unsigned_char>(value,local_8c2);
    *it = *it + 2;
  } while ((**it == '\0') || (**it == ','));
  std::__cxx11::stringstream::stringstream(local_a50);
  uVar4 = std::numeric_limits<unsigned_long>::max();
  if (uVar4 == *lineNumber) {
    poVar5 = std::operator<<(local_a40,"Invalid network data: ");
    poVar5 = std::operator<<(poVar5,"two subsequent values");
    std::operator<<(poVar5,'\n');
  }
  else {
    poVar5 = std::operator<<(local_a40,"Invalid file format: ");
    poVar5 = std::operator<<(poVar5,"two subsequent values");
    poVar5 = std::operator<<(poVar5," in line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*lineNumber);
    std::operator<<(poVar5,'\n');
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar6,local_a70);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ParseHexData(bhf::ads::RegistryEntry& value, const char*& it, std::istream& input, size_t& lineNumber)
{
    std::string line{};
    for ( ; '\0' != *it; ) {
        // Skip commas but ensure there is exactly one
        if (',' == *it) {
            ++it;
            if (',' == *it) {
                PARSING_EXCEPTION("two subsequent commas");
            }
            continue;
        }

        // Data is allowed to containe linebreaks. However, we treat comments or empty lines
        // in such a multiline data section as error.
        if ('\\' == *it) {
            ++it;
            if ('\0' != *it) {
                PARSING_EXCEPTION("data continuation line should be the las character in line");
            }

            if (!std::getline(input, line)) {
                PARSING_EXCEPTION("data continuation line next line is missing");
            }
            it = line.c_str();
            if (strncmp("  ", it, 2)) {
                PARSING_EXCEPTION("data continuation line should start with two spaces");
            }
            it += 2;
        }

        // We only accept hex data values consisting of two characters (trailing 0)
        for (auto i = 0; i < 2; ++i) {
            if (!isxdigit(it[i])) {
                PARSING_EXCEPTION("invalid hex character '" << it[i] << "'");
            }
        }
        const uint8_t byte = (hex2val(it[0]) << 4) | (hex2val(it[1]) & 0xF);
        value.PushData(byte);
        it += 2;

        // Hex data values should be separated by a comma
        if (*it && (',' != *it)) {
            PARSING_EXCEPTION("two subsequent values");
        }
    }
    VerifyDataLen(value.type, value.dataLen, lineNumber);
}